

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<char_const(&)[63],kj::String&,char_const(&)[24]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [63],String *params_1,
          char (*params_2) [24])

{
  Branch *pBVar1;
  kj *local_50;
  char *local_48;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_48 = (char *)strlen((char *)this);
  pBVar1 = *(Branch **)(*params + 8);
  local_30.ptr = (char *)pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_30.ptr = *(char **)*params;
  }
  local_30.size_ = (size_t)(undefined1 *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_30.size_ = (size_t)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_50 = this;
  local_40.size_ = strlen((char *)params_1);
  local_40.ptr = (char *)params_1;
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_50,&local_30,&local_40,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}